

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O0

void __thiscall OpenMD::RestReader::readFrameProperties(RestReader *this,istream *inputStream)

{
  bool bVar1;
  long lVar2;
  long *plVar3;
  char *in_RSI;
  long in_RDI;
  string line;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::istream::getline(in_RSI,in_RDI + 0x68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  lVar2 = std::__cxx11::string::find(&stack0xffffffffffffffd0,0x4248a0);
  if (lVar2 == -1) {
    snprintf(painCave.errMsg,2000,"RestReader Error: Missing <FrameData>\n");
    painCave.isFatal = 1;
    simError();
  }
  do {
    plVar3 = (long *)std::istream::getline(in_RSI,in_RDI + 0x68);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffd0,(char *)(in_RDI + 0x68));
    lVar2 = std::__cxx11::string::find(&stack0xffffffffffffffd0,0x4248d3);
  } while (lVar2 == -1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void RestReader::readFrameProperties(std::istream& inputStream) {
    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<FrameData>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: Missing <FrameData>\n");
      painCave.isFatal = 1;
      simError();
    }

    // restraints don't care about frame data (unless we need to wrap
    // coordinates, but we'll worry about that later), so
    // we'll just scan ahead until the end of the frame data:

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</FrameData>") != std::string::npos) { break; }
    }
  }